

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void createBackup(string *fileName,int dublicateNumber)

{
  path dst;
  path src;
  string local_50;
  string dstPath;
  
  std::operator+(&dst._M_pathname,"backups/",fileName);
  std::__cxx11::to_string(&local_50,dublicateNumber);
  std::operator+(&src._M_pathname,&dst._M_pathname,&local_50);
  std::operator+(&dstPath,&src._M_pathname,".log");
  std::__cxx11::string::~string((string *)&src);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&dst);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&src,fileName);
  std::experimental::filesystem::v1::__cxx11::path::
  path<char[8],std::experimental::filesystem::v1::__cxx11::path>(&dst,(char (*) [8])"backups");
  std::experimental::filesystem::v1::create_directory(&dst);
  std::experimental::filesystem::v1::__cxx11::path::~path(&dst);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&dst,&dstPath);
  std::experimental::filesystem::v1::copy(&src,&dst,overwrite_existing);
  std::experimental::filesystem::v1::__cxx11::path::~path(&dst);
  std::experimental::filesystem::v1::__cxx11::path::~path(&src);
  std::__cxx11::string::~string((string *)&dstPath);
  return;
}

Assistant:

void createBackup(std::string fileName, int dublicateNumber) {
    std::string dstPath = "backups/" + fileName + std::to_string(dublicateNumber) + ".log";
    const std::experimental::filesystem::path src = fileName;
    std::experimental::filesystem::create_directory("backups");
    const std::experimental::filesystem::path dst = dstPath;
    std::experimental::filesystem::copy(src, dst, std::experimental::filesystem::copy_options::overwrite_existing);
}